

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void units::shorten_number(string *unit_string,size_t loc,size_t length)

{
  pointer pcVar1;
  char *pcVar2;
  char cVar3;
  long lVar4;
  long lVar5;
  
  pcVar1 = (unit_string->_M_dataplus)._M_p;
  cVar3 = pcVar1[loc];
  if (cVar3 == '.') {
    cVar3 = pcVar1[loc + 1];
  }
  std::__cxx11::string::erase((ulong)unit_string,loc);
  if (cVar3 == '9') {
    pcVar2 = (unit_string->_M_dataplus)._M_p;
    lVar5 = loc - 1;
    if (pcVar2[loc - 1] == '9') {
      do {
        pcVar2[lVar5] = '0';
        lVar4 = lVar5 + -1;
        if (lVar5 == 0) {
          pcVar2 = (unit_string->_M_dataplus)._M_p;
          goto LAB_00189e81;
        }
        pcVar2 = (unit_string->_M_dataplus)._M_p;
        cVar3 = pcVar2[lVar5 + -1];
        lVar5 = lVar4;
      } while (cVar3 == '9');
      if (lVar4 == 0) {
LAB_00189e81:
        cVar3 = *pcVar2;
        if (cVar3 == '0') {
          std::__cxx11::string::_M_replace_aux((ulong)unit_string,0,0,'\x01');
          return;
        }
        lVar4 = 0;
      }
      if (9 < (byte)(cVar3 - 0x30U)) {
        std::__cxx11::string::insert((ulong)unit_string,lVar4 + 1,'\x01');
        return;
      }
      pcVar2[lVar4] = cVar3 + '\x01';
    }
    else {
      pcVar2[lVar5] = pcVar2[loc - 1] + '\x01';
    }
  }
  return;
}

Assistant:

static void shorten_number(std::string& unit_string, size_t loc, size_t length)
{
    auto c = unit_string[loc];
    if (c == '.') {
        c = unit_string[loc + 1];
    }
    unit_string.erase(loc, length);
    if (c == '9') {
        if (unit_string[loc - 1] != '9') {
            ++unit_string[loc - 1];
        } else {
            int kk = 1;
            while (unit_string[loc - kk] == '9') {
                unit_string[loc - kk] = '0';
                if (loc - kk == 0) {
                    break;
                }
                ++kk;
            }
            if (loc - kk == 0 && unit_string[0] == '0') {
                unit_string.insert(unit_string.begin(), '1');
            } else {
                if (isDigitCharacter(unit_string[loc - kk])) {
                    ++unit_string[loc - kk];
                } else {
                    unit_string.insert(loc - kk + 1, 1, '1');
                }
            }
        }
    }
}